

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullsearch.cpp
# Opt level: O2

Position __thiscall FullSearch::getNextAction(FullSearch *this,Board *board)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Position *choose;
  Position bestChoose;
  vector<Position,_std::allocator<Position>_> possibleChoose;
  Board tmpBoard;
  Position local_a8;
  _Vector_base<Position,_std::allocator<Position>_> local_a0;
  Board local_88;
  
  Board::Board(&local_88,board);
  Board::findPossibleChoose((vector<Position,_std::allocator<Position>_> *)&local_a0,&local_88);
  Position::Position(&local_a8);
  iVar3 = -0x80000000;
  for (; local_a0._M_impl.super__Vector_impl_data._M_start !=
         local_a0._M_impl.super__Vector_impl_data._M_finish;
      local_a0._M_impl.super__Vector_impl_data._M_start =
           local_a0._M_impl.super__Vector_impl_data._M_start + 1) {
    Board::operator=(&local_88,board);
    Board::doChoose(&local_88,*local_a0._M_impl.super__Vector_impl_data._M_start);
    iVar1 = search(this,&local_88);
    iVar2 = -iVar1;
    if (2 < iVar1 + 1U) {
      iVar2 = iVar1;
    }
    if (local_88.nowPlayer == board->nowPlayer) {
      iVar2 = iVar1;
    }
    if (iVar3 < iVar2) {
      local_a8 = *local_a0._M_impl.super__Vector_impl_data._M_start;
      iVar3 = iVar2;
      if (iVar2 == 1) break;
    }
  }
  std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base(&local_a0);
  return local_a8;
}

Assistant:

Position FullSearch::getNextAction(const Board &board) {
    Board tmpBoard = board;
    vector<Position> possibleChoose = tmpBoard.findPossibleChoose();
    Position bestChoose;
    int bestValue = INT_MIN;
    for (const Position &choose : possibleChoose) {
        tmpBoard = board;
        tmpBoard.doChoose(choose);
        int value = search(tmpBoard);

        if (tmpBoard.nowPlayer != board.nowPlayer) {
            switch (value) {
                case WIN:
                    value = LOST;
                    break;
                case LOST:
                    value = WIN;
                    break;
                case TIE:
                    value = TIE;
                    break;
            }
        }
        if (value > bestValue) {
            bestValue = value;
            bestChoose = choose;
        }

        //fprintf(stderr, "value = %d\n", value);
        if (bestValue == WIN) {
            //fprintf(stderr, "%s think he will win\n", board.nowPlayer == Board::BLACK ? "black" : "white");
            break;
        }
    }

    if (bestValue == LOST) {
        //fprintf(stderr, "%s think he will lose\n", board.nowPlayer == Board::BLACK ? "black" : "white");
    }

    return bestChoose;
}